

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngread.c
# Opt level: O0

int png_image_begin_read_from_stdio(png_imagep image,FILE *file)

{
  int iVar1;
  FILE *file_local;
  png_imagep image_local;
  
  if ((image == (png_imagep)0x0) || (image->version != 1)) {
    if (image != (png_imagep)0x0) {
      iVar1 = png_image_error(image,"png_image_begin_read_from_stdio: incorrect PNG_IMAGE_VERSION");
      return iVar1;
    }
  }
  else {
    if (file == (FILE *)0x0) {
      iVar1 = png_image_error(image,"png_image_begin_read_from_stdio: invalid argument");
      return iVar1;
    }
    iVar1 = png_image_read_init(image);
    if (iVar1 != 0) {
      image->opaque->png_ptr->io_ptr = file;
      iVar1 = png_safe_execute(image,png_image_read_header,image);
      return iVar1;
    }
  }
  return 0;
}

Assistant:

int PNGAPI
png_image_begin_read_from_stdio(png_imagep image, FILE* file)
{
   if (image != NULL && image->version == PNG_IMAGE_VERSION)
   {
      if (file != NULL)
      {
         if (png_image_read_init(image) != 0)
         {
            /* This is slightly evil, but png_init_io doesn't do anything other
             * than this and we haven't changed the standard IO functions so
             * this saves a 'safe' function.
             */
            image->opaque->png_ptr->io_ptr = file;
            return png_safe_execute(image, png_image_read_header, image);
         }
      }

      else
         return png_image_error(image,
             "png_image_begin_read_from_stdio: invalid argument");
   }

   else if (image != NULL)
      return png_image_error(image,
          "png_image_begin_read_from_stdio: incorrect PNG_IMAGE_VERSION");

   return 0;
}